

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

optional<tinyusdz::Path> * __thiscall
tinyusdz::MetaVariable::get_value<tinyusdz::Path>
          (optional<tinyusdz::Path> *__return_storage_ptr__,MetaVariable *this)

{
  Path *rhs;
  
  rhs = tinyusdz::value::Value::as<tinyusdz::Path>(&this->_value,false);
  if (rhs == (Path *)0x0) {
    __return_storage_ptr__->has_value_ = false;
    memset(&__return_storage_ptr__->contained,0,0xd0);
  }
  else {
    __return_storage_ptr__->has_value_ = true;
    Path::Path((Path *)&__return_storage_ptr__->contained,rhs);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    if (const T *v = _value.as<T>()) {
      return *v;
    }

    return nonstd::nullopt;
  }